

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O1

bool Inferences::anon_unknown_1::isIntegerComparisonLiteral(Literal *lit)

{
  bool bVar1;
  uint uVar2;
  Interpretation IVar3;
  
  uVar2 = Kernel::Term::numVarOccs(&lit->super_Term);
  if ((uVar2 == 0) &&
     (bVar1 = Kernel::Theory::isInterpretedPredicate((Theory *)Kernel::theory,lit), bVar1)) {
    IVar3 = Kernel::Theory::interpretPredicate((Theory *)Kernel::theory,lit);
    return IVar3 == INT_LESS;
  }
  return false;
}

Assistant:

bool isIntegerComparisonLiteral(Literal* lit) {
  if (!lit->ground() || !theory->isInterpretedPredicate(lit)) return false;
  switch (theory->interpretPredicate(lit)) {
    case Theory::INT_LESS:
      // The only supported integer comparison predicate is INT_LESS.
      break;
    case Theory::INT_LESS_EQUAL:
    case Theory::INT_GREATER_EQUAL:
    case Theory::INT_GREATER:
      // All formulas should be normalized to only use INT_LESS and not other integer comparison predicates.

      // Equality proxy may generate useless congruence axioms for the likes of INT_GREATER
      // (although they only appeared in the input and are eliminated by now -> but this also means they are safe to ingore)
      ASS_EQ(env.options->equalityProxy(),Options::EqualityProxy::RSTC);
    default:
      // Not an integer comparison.
      return false;
  }
  return true;
}